

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandBm2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  char *newName_3;
  char *newName_2;
  char *newName_1;
  char *newName;
  int i;
  int nArgcNew;
  int c;
  char **pArgvNew;
  Abc_Obj_t *pObj;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtk;
  FILE *pErr;
  FILE *pOut;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pOut = (FILE *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  pNtk1 = Abc_FrameReadNtk(pAbc);
  pErr = Abc_FrameReadOut(pAStack_18);
  pNtk = (Abc_Ntk_t *)Abc_FrameReadErr(pAStack_18);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)pOut,"h");
  if (iVar1 == -1) {
    iVar1 = Abc_NtkPrepareTwoNtks
                      ((FILE *)pNtk,pNtk1,(char **)(&pOut->_flags + (long)globalUtilOptind * 2),
                       argv_local._4_4_ - globalUtilOptind,&pNtk2,(Abc_Ntk_t **)&fDelete2,
                       (int *)((long)&pObj + 4),(int *)&pObj);
    if (iVar1 != 0) {
      iVar1 = Abc_NtkPiNum(pNtk2);
      iVar2 = Abc_NtkPiNum(_fDelete2);
      if (iVar1 == iVar2) {
        iVar1 = Abc_NtkPoNum(pNtk2);
        iVar2 = Abc_NtkPoNum(_fDelete2);
        if (iVar1 == iVar2) {
          Abc_NtkPermute(_fDelete2,1,1,0,(char *)0x0);
          Abc_NtkShortNames(_fDelete2);
          for (newName._4_4_ = 0; iVar1 = Abc_NtkCiNum(pNtk2), newName._4_4_ < iVar1;
              newName._4_4_ = newName._4_4_ + 1) {
            pAVar3 = Abc_NtkCi(pNtk2,newName._4_4_);
            pcVar4 = Abc_ObjNamePrefix(pAVar3,"N1:");
            Nm_ManDeleteIdName(pNtk2->pManName,pAVar3->Id);
            Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
          }
          for (newName._4_4_ = 0; iVar1 = Abc_NtkCoNum(pNtk2), newName._4_4_ < iVar1;
              newName._4_4_ = newName._4_4_ + 1) {
            pAVar3 = Abc_NtkCo(pNtk2,newName._4_4_);
            pcVar4 = Abc_ObjNamePrefix(pAVar3,"N1:");
            Nm_ManDeleteIdName(pNtk2->pManName,pAVar3->Id);
            Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
          }
          for (newName._4_4_ = 0; iVar1 = Abc_NtkCiNum(_fDelete2), newName._4_4_ < iVar1;
              newName._4_4_ = newName._4_4_ + 1) {
            pAVar3 = Abc_NtkCi(_fDelete2,newName._4_4_);
            pcVar4 = Abc_ObjNamePrefix(pAVar3,"N2:");
            Nm_ManDeleteIdName(_fDelete2->pManName,pAVar3->Id);
            Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
          }
          for (newName._4_4_ = 0; iVar1 = Abc_NtkCoNum(_fDelete2), newName._4_4_ < iVar1;
              newName._4_4_ = newName._4_4_ + 1) {
            pAVar3 = Abc_NtkCo(_fDelete2,newName._4_4_);
            pcVar4 = Abc_ObjNamePrefix(pAVar3,"N2:");
            Nm_ManDeleteIdName(_fDelete2->pManName,pAVar3->Id);
            Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
          }
          Abc_NtkAppend(pNtk2,_fDelete2,1);
          saucyGateWay(pNtk2,(Abc_Obj_t *)0x0,(FILE *)0x0,1,0,0,0,0,0);
          if (pObj._4_4_ != 0) {
            Abc_NtkDelete(pNtk2);
          }
          if ((int)pObj != 0) {
            Abc_NtkDelete(_fDelete2);
          }
          return 0;
        }
      }
      Abc_Print(-2,"Mismatch in the number of inputs or outputs\n");
      Abc_Print(-2,"*** Networks are NOT equivalent ***\n");
      if (pObj._4_4_ != 0) {
        Abc_NtkDelete(pNtk2);
      }
      if ((int)pObj != 0) {
        Abc_NtkDelete(_fDelete2);
      }
    }
  }
  else {
    if (iVar1 != 0x68) {
      Abc_Print(-2,"Unknown switch.\n");
    }
    Abc_Print(-2,"usage: bm2  <file1> <file2>\n");
    Abc_Print(-2,"\t        performs Boolean matching (PP-equivalence)\n");
    Abc_Print(-2,"\t        for equivalent circuits, permutation that maps one circuit\n");
    Abc_Print(-2,"\t        to another is printed to standard output (PIs and POs of the\n");
    Abc_Print(-2,"\t        first network have prefix \"N1:\", while PIs and POs of the\n");
    Abc_Print(-2,"\t        second network have prefix \"N2:\")\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    Abc_Print(-2,"\tfile1 : the file with the first network\n");
    Abc_Print(-2,"\tfile2 : the file with the second network\n");
    Abc_Print(-2,"\t        \n");
    Abc_Print(-2,"\t        This command was contributed by Hadi Katebi from U Michigan.\n");
    Abc_Print(-2,"\t        The paper describing the method: H. Katebi, K. Sakallah and\n");
    Abc_Print(-2,"\t        I. L. Markov.\n");
    Abc_Print(-2,"\t        \"Generalized Boolean Symmetries Through Nested Partition\n");
    Abc_Print(-2,"\t        Refinement\". Proc. ICCAD 2013. \n");
  }
  return 1;
}

Assistant:

int Abc_CommandBm2( Abc_Frame_t * pAbc, int argc, char ** argv )
{   
    FILE * pOut, * pErr;
    Abc_Ntk_t *pNtk, *pNtk1, *pNtk2;
    int fDelete1, fDelete2; 
    Abc_Obj_t * pObj;
    char ** pArgvNew;
    int c, nArgcNew, i; 

    extern void saucyGateWay( Abc_Ntk_t * pNtk, Abc_Obj_t * pNodePo, FILE * gFile, int fBooleanMatching,
                              int fLookForSwaps, int fFixOutputs, int fFixInputs, int fQuiet, int fPrintTree);

    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);  
    
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;        
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( !Abc_NtkPrepareTwoNtks( pErr, pNtk, pArgvNew, nArgcNew , &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
        return 1;
        
    if( (unsigned)Abc_NtkPiNum(pNtk1) != (unsigned)Abc_NtkPiNum(pNtk2) || 
        (unsigned)Abc_NtkPoNum(pNtk1) != (unsigned)Abc_NtkPoNum(pNtk2) )
    {
        Abc_Print( -2, "Mismatch in the number of inputs or outputs\n");
        Abc_Print( -2, "*** Networks are NOT equivalent ***\n");
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
        return 1;
    }
    
    Abc_NtkPermute(pNtk2, 1, 1, 0, NULL );
    Abc_NtkShortNames(pNtk2);

    Abc_NtkForEachCi( pNtk1, pObj, i ) {
        char * newName = Abc_ObjNamePrefix( pObj, "N1:" );
        Nm_ManDeleteIdName( pNtk1->pManName, pObj->Id);
        Abc_ObjAssignName( pObj, newName, NULL );
    }
    Abc_NtkForEachCo( pNtk1, pObj, i ) {
        char * newName = Abc_ObjNamePrefix( pObj, "N1:" );
        Nm_ManDeleteIdName( pNtk1->pManName, pObj->Id);
        Abc_ObjAssignName( pObj, newName, NULL );
    }

    Abc_NtkForEachCi( pNtk2, pObj, i ) {
        char * newName = Abc_ObjNamePrefix( pObj, "N2:" );
        Nm_ManDeleteIdName( pNtk2->pManName, pObj->Id);
        Abc_ObjAssignName( pObj, newName, NULL );
    }
    Abc_NtkForEachCo( pNtk2, pObj, i ) {
        char * newName = Abc_ObjNamePrefix( pObj, "N2:" );
        Nm_ManDeleteIdName( pNtk2->pManName, pObj->Id);
        Abc_ObjAssignName( pObj, newName, NULL );
    }

    Abc_NtkAppend( pNtk1, pNtk2, 1 );
    saucyGateWay( pNtk1, NULL, NULL, 1, 0, 0, 0, 0, 0);

    if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
    if ( fDelete2 ) Abc_NtkDelete( pNtk2 );     
    return 0;

usage:
    Abc_Print( -2, "usage: bm2  <file1> <file2>\n" );
    Abc_Print( -2, "\t        performs Boolean matching (PP-equivalence)\n" );
    Abc_Print( -2, "\t        for equivalent circuits, permutation that maps one circuit\n" );
    Abc_Print( -2, "\t        to another is printed to standard output (PIs and POs of the\n" );
    Abc_Print( -2, "\t        first network have prefix \"N1:\", while PIs and POs of the\n" ); 
    Abc_Print( -2, "\t        second network have prefix \"N2:\")\n" ); 
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\tfile1 : the file with the first network\n");
    Abc_Print( -2, "\tfile2 : the file with the second network\n");

    Abc_Print( -2, "\t        \n" );
    Abc_Print( -2, "\t        This command was contributed by Hadi Katebi from U Michigan.\n" );
    Abc_Print( -2, "\t        The paper describing the method: H. Katebi, K. Sakallah and\n");
    Abc_Print( -2, "\t        I. L. Markov.\n" );
    Abc_Print( -2, "\t        \"Generalized Boolean Symmetries Through Nested Partition\n");
    Abc_Print( -2, "\t        Refinement\". Proc. ICCAD 2013. \n" );
    //Abc_Print( -2, "\t        http://www.eecs.umich.edu/~imarkov/pubs/conf/date10-match.pdf\n" );
//    Abc_Print( -2, "\t        \n" );

    return 1;
}